

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O1

ExecutionMode __thiscall
Js::FunctionExecutionStateMachine::GetInterpreterExecutionMode
          (FunctionExecutionStateMachine *this,bool isPostBailout)

{
  code *pcVar1;
  bool bVar2;
  ExecutionMode EVar3;
  ExecutionState state;
  undefined4 *puVar4;
  char *this_00;
  FunctionExecutionStateMachine *this_01;
  
  this_00 = (char *)this;
  if (this->initializedExecutionModeAndLimits == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    this_00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
    ;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x10c,"(initializedExecutionModeAndLimits)",
                                "initializedExecutionModeAndLimits");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (isPostBailout) {
    this_00 = (char *)(this->owner).ptr;
    bVar2 = FunctionBody::DoInterpreterProfile((FunctionBody *)this_00);
    if (bVar2) {
      return ProfilingInterpreter;
    }
  }
  EVar3 = StateToMode((FunctionExecutionStateMachine *)this_00,this->executionState);
  this_01 = this;
  VerifyExecutionMode(this,EVar3);
  if (EVar3 < SimpleJit) {
    EVar3 = StateToMode(this_01,this->executionState);
  }
  else {
    if ((EVar3 == SimpleJit) && (DAT_015bbe4c == '\x01')) {
      state = GetDefaultInterpreterExecutionState(this);
      EVar3 = StateToMode(this,state);
      return EVar3;
    }
    bVar2 = FunctionBody::DoInterpreterProfile((this->owner).ptr);
    EVar3 = bVar2 * '\x02';
  }
  VerifyExecutionMode(this,EVar3);
  return EVar3;
}

Assistant:

ExecutionMode FunctionExecutionStateMachine::GetInterpreterExecutionMode(const bool isPostBailout)
    {
        Assert(initializedExecutionModeAndLimits);

        if (isPostBailout && owner->DoInterpreterProfile())
        {
            return ExecutionMode::ProfilingInterpreter;
        }

        switch (GetExecutionMode())
        {
        case ExecutionMode::Interpreter:
        case ExecutionMode::AutoProfilingInterpreter:
        case ExecutionMode::ProfilingInterpreter:
            return GetExecutionMode();

        case ExecutionMode::SimpleJit:
            if (CONFIG_FLAG(NewSimpleJit))
            {
                return StateToMode(GetDefaultInterpreterExecutionState());
            }
            // fall through

        case ExecutionMode::FullJit:
        {
            const ExecutionMode executionMode =
                owner->DoInterpreterProfile() ? ExecutionMode::ProfilingInterpreter : ExecutionMode::Interpreter;
            VerifyExecutionMode(executionMode);
            return executionMode;
        }

        default:
            Assert(false);
            __assume(false);
        }
    }